

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  UnlockedPoolAllocatorPrivate *pUVar6;
  void *ptr;
  _List_node_base *local_30;
  
  pUVar6 = this->d;
  p_Var4 = (pUVar6->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var4 == (_List_node_base *)&pUVar6->budgets) {
      local_30 = (_List_node_base *)0x0;
      iVar3 = posix_memalign(&local_30,0x10,size + 0x40);
      p_Var5 = (_List_node_base *)0x0;
      if (iVar3 == 0) {
        p_Var5 = local_30;
      }
      pUVar6 = this->d;
      p_Var4 = (_List_node_base *)operator_new(0x20);
      p_Var4[1]._M_next = (_List_node_base *)size;
LAB_0014c630:
      p_Var4[1]._M_prev = p_Var5;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(pUVar6->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return p_Var5;
    }
    p_Var2 = p_Var4[1]._M_next;
    if ((size <= p_Var2) && ((ulong)pUVar6->size_compare_ratio * (long)p_Var2 >> 8 <= size)) {
      p_Var5 = p_Var4[1]._M_prev;
      psVar1 = &(pUVar6->budgets).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x20);
      pUVar6 = this->d;
      p_Var4 = (_List_node_base *)operator_new(0x20);
      p_Var4[1]._M_next = p_Var2;
      goto LAB_0014c630;
    }
    p_Var4 = p_Var4->_M_next;
  } while( true );
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}